

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int canvas_getconns(t_object *objsrc,int *outno,t_object *objsink,int *inno)

{
  int iVar1;
  int iVar2;
  _outconnect *lastconnect;
  int nout;
  int which;
  t_object *o;
  _outlet *out;
  _inlet *in;
  int local_64;
  t_object *local_60;
  int *local_58;
  int *local_50;
  t_object *local_48;
  _outlet *local_40;
  _inlet *local_38;
  
  local_58 = outno;
  local_50 = inno;
  iVar1 = obj_noutlets(objsrc);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    nout = 0;
    iVar1 = 0;
    local_60 = objsrc;
    do {
      local_40 = (_outlet *)0x0;
      lastconnect = obj_starttraverseoutlet(objsrc,&local_40,nout);
      if (lastconnect != (_outconnect *)0x0) {
        do {
          lastconnect = obj_nexttraverseoutlet(lastconnect,&local_48,&local_38,&local_64);
          if (local_48 == objsink) {
            *local_58 = nout;
            *local_50 = local_64;
            iVar1 = iVar1 + 1;
          }
        } while (lastconnect != (_outconnect *)0x0);
      }
      objsrc = local_60;
      nout = nout + 1;
      iVar2 = obj_noutlets(local_60);
    } while (nout < iVar2);
  }
  return iVar1;
}

Assistant:

static int canvas_getconns(t_object*objsrc, int *outno, t_object*objsink, int *inno)
{
    int count = 0;
    int n;
    for(n=0; n<obj_noutlets(objsrc); n++)
    {
        t_outlet*out = 0;
        t_outconnect *oc = obj_starttraverseoutlet(objsrc, &out, n);
        while(oc)
        {
            t_object*o;
            t_inlet*in;
            int which;
            oc = obj_nexttraverseoutlet(oc, &o, &in, &which);
            if(o == objsink)
                *outno = n, *inno = which, count++;
        }
    }
    return count;
}